

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan.c
# Opt level: O3

parasail_result_t *
parasail_nw_stats_table_scan
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  undefined4 uVar1;
  parasail_result_t *ppVar2;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  int *ptr_03;
  int *ptr_04;
  int *ptr_05;
  int *ptr_06;
  int *ptr_07;
  int *ptr_08;
  int *ptr_09;
  int *ptr_10;
  int *ptr_11;
  int *ptr_12;
  int *ptr_13;
  long lVar3;
  int a;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int *piVar9;
  ulong uVar10;
  int *piVar11;
  size_t size;
  ulong size_00;
  int iVar12;
  int iVar13;
  size_t size_01;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined4 local_cc;
  undefined4 local_c8;
  
  if (_s2 == (char *)0x0) {
    parasail_nw_stats_table_scan_cold_8();
    return (parasail_result_t *)0x0;
  }
  if (s2Len < 1) {
    parasail_nw_stats_table_scan_cold_7();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_nw_stats_table_scan_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_nw_stats_table_scan_cold_5();
    return (parasail_result_t *)0x0;
  }
  uVar7 = (ulong)(uint)_s1Len;
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_nw_stats_table_scan_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 1) {
    if (_s1 == (char *)0x0) {
      parasail_nw_stats_table_scan_cold_3();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    if (_s1 == (char *)0x0) {
      parasail_nw_stats_table_scan_cold_2();
      return (parasail_result_t *)0x0;
    }
    if (_s1Len < 1) {
      parasail_nw_stats_table_scan_cold_1();
      return (parasail_result_t *)0x0;
    }
    if (matrix->type == 0) goto LAB_00557bfa;
  }
  uVar7 = (ulong)(uint)matrix->length;
LAB_00557bfa:
  a = (int)uVar7;
  ppVar2 = parasail_result_new_table3(a,s2Len);
  if (ppVar2 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar2->flag = ppVar2->flag | 0x1430201;
  size_01 = (size_t)a;
  ptr = parasail_memalign_int(0x10,size_01);
  size_00 = (ulong)(uint)s2Len;
  ptr_00 = parasail_memalign_int(0x10,size_00);
  size = (size_t)(a + 1);
  ptr_01 = parasail_memalign_int(0x10,size);
  ptr_02 = parasail_memalign_int(0x10,size);
  ptr_03 = parasail_memalign_int(0x10,size);
  ptr_04 = parasail_memalign_int(0x10,size);
  ptr_05 = parasail_memalign_int(0x10,size_01);
  ptr_06 = parasail_memalign_int(0x10,size_01);
  ptr_07 = parasail_memalign_int(0x10,size_01);
  ptr_08 = parasail_memalign_int(0x10,size_01);
  ptr_09 = parasail_memalign_int(0x10,size);
  ptr_10 = parasail_memalign_int(0x10,size);
  ptr_11 = parasail_memalign_int(0x10,size);
  ptr_12 = parasail_memalign_int(0x10,size);
  ptr_13 = parasail_memalign_int(0x10,size_01);
  auVar15._0_4_ = -(uint)((int)ptr == 0);
  auVar15._4_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0);
  auVar15._8_4_ = -(uint)((int)ptr_00 == 0);
  auVar15._12_4_ = -(uint)((int)((ulong)ptr_00 >> 0x20) == 0);
  auVar21._4_4_ = auVar15._0_4_;
  auVar21._0_4_ = auVar15._4_4_;
  auVar21._8_4_ = auVar15._12_4_;
  auVar21._12_4_ = auVar15._8_4_;
  auVar17._0_4_ = -(uint)((int)ptr_01 == 0);
  auVar17._4_4_ = -(uint)((int)((ulong)ptr_01 >> 0x20) == 0);
  auVar17._8_4_ = -(uint)((int)ptr_02 == 0);
  auVar17._12_4_ = -(uint)((int)((ulong)ptr_02 >> 0x20) == 0);
  auVar22._4_4_ = auVar17._0_4_;
  auVar22._0_4_ = auVar17._4_4_;
  auVar22._8_4_ = auVar17._12_4_;
  auVar22._12_4_ = auVar17._8_4_;
  auVar22 = packssdw(auVar21 & auVar15,auVar22 & auVar17);
  auVar19._0_4_ = -(uint)((int)ptr_03 == 0);
  auVar19._4_4_ = -(uint)((int)((ulong)ptr_03 >> 0x20) == 0);
  auVar19._8_4_ = -(uint)((int)ptr_04 == 0);
  auVar19._12_4_ = -(uint)((int)((ulong)ptr_04 >> 0x20) == 0);
  auVar14._4_4_ = auVar19._0_4_;
  auVar14._0_4_ = auVar19._4_4_;
  auVar14._8_4_ = auVar19._12_4_;
  auVar14._12_4_ = auVar19._8_4_;
  auVar20._0_4_ = -(uint)((int)ptr_05 == 0);
  auVar20._4_4_ = -(uint)((int)((ulong)ptr_05 >> 0x20) == 0);
  auVar20._8_4_ = -(uint)((int)ptr_06 == 0);
  auVar20._12_4_ = -(uint)((int)((ulong)ptr_06 >> 0x20) == 0);
  auVar18._4_4_ = auVar20._0_4_;
  auVar18._0_4_ = auVar20._4_4_;
  auVar18._8_4_ = auVar20._12_4_;
  auVar18._12_4_ = auVar20._8_4_;
  auVar15 = packssdw(auVar14 & auVar19,auVar18 & auVar20);
  auVar15 = packssdw(auVar22,auVar15);
  if ((((((((auVar15 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar15 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar15 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar15 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar15 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar15 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar15 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar15[0xf] < '\0') {
    return (parasail_result_t *)0x0;
  }
  auVar16._0_4_ = -(uint)((int)((ulong)ptr_07 >> 0x20) == 0 && (int)ptr_07 == 0);
  auVar16._4_4_ = -(uint)((int)ptr_08 == 0 && (int)((ulong)ptr_08 >> 0x20) == 0);
  auVar16._8_4_ = -(uint)((int)((ulong)ptr_09 >> 0x20) == 0 && (int)ptr_09 == 0);
  auVar16._12_4_ = -(uint)((int)ptr_10 == 0 && (int)((ulong)ptr_10 >> 0x20) == 0);
  uVar1 = movmskps((int)ptr_10,auVar16);
  if ((char)uVar1 != '\0') {
    return (parasail_result_t *)0x0;
  }
  if (ptr_11 == (int *)0x0) {
    return (parasail_result_t *)0x0;
  }
  if (ptr_12 == (int *)0x0) {
    return (parasail_result_t *)0x0;
  }
  if (ptr_13 == (int *)0x0) {
    return (parasail_result_t *)0x0;
  }
  if (0 < a) {
    piVar9 = matrix->mapper;
    uVar8 = 0;
    do {
      ptr[uVar8] = piVar9[(byte)_s1[uVar8]];
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  piVar11 = ptr_04 + 1;
  piVar9 = matrix->mapper;
  uVar8 = 0;
  do {
    ptr_00[uVar8] = piVar9[(byte)_s2[uVar8]];
    uVar8 = uVar8 + 1;
  } while (size_00 != uVar8);
  *ptr_01 = 0;
  *ptr_02 = 0;
  *ptr_03 = 0;
  *ptr_04 = 0;
  *ptr_09 = 0;
  if (0 < a) {
    iVar4 = -open;
    uVar8 = 0;
    do {
      ptr_01[uVar8 + 1] = iVar4;
      ptr_02[uVar8 + 1] = 0;
      ptr_03[uVar8 + 1] = 0;
      piVar11[uVar8] = 0;
      uVar8 = uVar8 + 1;
      iVar4 = iVar4 - gap;
    } while (uVar7 != uVar8);
    if (0 < a) {
      uVar8 = 0;
      do {
        ptr_05[uVar8] = -0x40000000;
        ptr_06[uVar8] = 0;
        ptr_07[uVar8] = 0;
        ptr_08[uVar8] = 0;
        uVar8 = uVar8 + 1;
      } while (uVar7 != uVar8);
    }
  }
  uVar8 = 0;
  do {
    if (a < 1) {
      iVar4 = -((int)uVar8 * gap + open);
      *ptr_09 = iVar4;
    }
    else {
      lVar3 = 0;
      do {
        iVar4 = *(int *)((long)ptr_01 + lVar3 + 4) - open;
        iVar12 = *(int *)((long)ptr_05 + lVar3) - gap;
        if (iVar12 < iVar4) {
          *(int *)((long)ptr_05 + lVar3) = iVar4;
          *(undefined4 *)((long)ptr_06 + lVar3) = *(undefined4 *)((long)ptr_02 + lVar3 + 4);
          *(undefined4 *)((long)ptr_07 + lVar3) = *(undefined4 *)((long)ptr_03 + lVar3 + 4);
          piVar9 = piVar11;
        }
        else {
          *(int *)((long)ptr_05 + lVar3) = iVar12;
          piVar9 = ptr_08;
        }
        *(int *)((long)ptr_08 + lVar3) = *(int *)((long)piVar9 + lVar3) + 1;
        lVar3 = lVar3 + 4;
      } while (uVar7 * 4 - lVar3 != 0);
      iVar4 = -((int)uVar8 * gap + open);
      *ptr_09 = iVar4;
      if (0 < a) {
        piVar9 = matrix->matrix;
        uVar10 = 0;
        do {
          if (matrix->type == 0) {
            iVar12 = ptr[uVar10];
          }
          else {
            iVar12 = (int)uVar10;
          }
          iVar12 = piVar9[(long)(matrix->size * iVar12) + (long)ptr_00[uVar8]];
          iVar13 = ptr_01[uVar10] + iVar12;
          ptr_13[uVar10] = (uint)(iVar13 < ptr_05[uVar10]);
          if (iVar13 < ptr_05[uVar10]) {
            ptr_09[uVar10 + 1] = ptr_05[uVar10];
            ptr_10[uVar10 + 1] = ptr_06[uVar10];
            ptr_11[uVar10 + 1] = ptr_07[uVar10];
            iVar12 = ptr_08[uVar10];
          }
          else {
            ptr_09[uVar10 + 1] = iVar13;
            ptr_10[uVar10 + 1] = (uint)(ptr[uVar10] == ptr_00[uVar8]) + ptr_02[uVar10];
            ptr_11[uVar10 + 1] = (uint)(0 < iVar12) + ptr_03[uVar10];
            iVar12 = ptr_04[uVar10] + 1;
          }
          ptr_12[uVar10 + 1] = iVar12;
          uVar10 = uVar10 + 1;
        } while (uVar7 != uVar10);
        if (0 < a) {
          iVar13 = -0x40000000;
          lVar3 = 0;
          iVar12 = 0;
          local_c8 = 0;
          local_cc = 0;
          uVar10 = uVar8;
          do {
            iVar5 = iVar13 - gap;
            iVar13 = *(int *)((long)ptr_09 + lVar3);
            if (*(int *)((long)ptr_09 + lVar3) <= iVar5) {
              iVar13 = iVar5;
            }
            if (iVar5 < *(int *)((long)ptr_01 + lVar3)) {
              local_cc = *(undefined4 *)((long)ptr_02 + lVar3);
              local_c8 = *(undefined4 *)((long)ptr_03 + lVar3);
              iVar12 = *(int *)((long)ptr_04 + lVar3);
            }
            iVar6 = iVar13 - open;
            iVar12 = iVar12 + 1;
            iVar5 = *(int *)((long)ptr_09 + lVar3 + 4);
            if (iVar6 < iVar5) {
              *(int *)((long)ptr_01 + lVar3 + 4) = iVar5;
LAB_00558183:
              *(undefined4 *)((long)ptr_02 + lVar3 + 4) = *(undefined4 *)((long)ptr_10 + lVar3 + 4);
              *(undefined4 *)((long)ptr_03 + lVar3 + 4) = *(undefined4 *)((long)ptr_11 + lVar3 + 4);
              iVar5 = *(int *)((long)ptr_12 + lVar3 + 4);
            }
            else {
              *(int *)((long)ptr_01 + lVar3 + 4) = iVar6;
              if ((*(int *)((long)ptr_09 + lVar3 + 4) == iVar6) &&
                 (*(int *)((long)ptr_13 + lVar3) == 0)) goto LAB_00558183;
              *(undefined4 *)((long)ptr_02 + lVar3 + 4) = local_cc;
              *(undefined4 *)((long)ptr_03 + lVar3 + 4) = local_c8;
              iVar5 = iVar12;
            }
            *(int *)((long)piVar11 + lVar3) = iVar5;
            *(undefined4 *)(*((ppVar2->field_4).trace)->trace_del_table + uVar10 * 4) =
                 *(undefined4 *)((long)ptr_01 + lVar3 + 4);
            *(undefined4 *)
             (*(long *)((long)((ppVar2->field_4).trace)->trace_del_table + 8) + uVar10 * 4) =
                 *(undefined4 *)((long)ptr_02 + lVar3 + 4);
            *(undefined4 *)
             (*(long *)((long)((ppVar2->field_4).trace)->trace_del_table + 0x10) + uVar10 * 4) =
                 *(undefined4 *)((long)ptr_03 + lVar3 + 4);
            *(undefined4 *)
             (*(long *)((long)((ppVar2->field_4).trace)->trace_del_table + 0x18) + uVar10 * 4) =
                 *(undefined4 *)((long)piVar11 + lVar3);
            lVar3 = lVar3 + 4;
            uVar10 = uVar10 + size_00;
          } while (uVar7 * 4 - lVar3 != 0);
        }
      }
    }
    *ptr_01 = iVar4;
    uVar8 = uVar8 + 1;
    if (uVar8 == size_00) {
      ppVar2->score = ptr_01[size_01];
      ppVar2->end_query = a + -1;
      ppVar2->end_ref = s2Len + -1;
      ((ppVar2->field_4).stats)->matches = ptr_02[size_01];
      ((ppVar2->field_4).stats)->similar = ptr_03[size_01];
      ((ppVar2->field_4).stats)->length = ptr_04[size_01];
      parasail_free(ptr_13);
      parasail_free(ptr_12);
      parasail_free(ptr_11);
      parasail_free(ptr_10);
      parasail_free(ptr_09);
      parasail_free(ptr_08);
      parasail_free(ptr_07);
      parasail_free(ptr_06);
      parasail_free(ptr_05);
      parasail_free(ptr_04);
      parasail_free(ptr_03);
      parasail_free(ptr_02);
      parasail_free(ptr_01);
      parasail_free(ptr_00);
      parasail_free(ptr);
      return ppVar2;
    }
  } while( true );
}

Assistant:

parasail_result_t* ENAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict HB = NULL;
    int * restrict H = NULL;
    int * restrict HMB = NULL;
    int * restrict HM = NULL;
    int * restrict HSB = NULL;
    int * restrict HS = NULL;
    int * restrict HLB = NULL;
    int * restrict HL = NULL;
    int * restrict E = NULL;
    int * restrict EM = NULL;
    int * restrict ES = NULL;
    int * restrict EL = NULL;
    int * restrict HtB = NULL;
    int * restrict Ht = NULL;
    int * restrict HtMB = NULL;
    int * restrict HtM = NULL;
    int * restrict HtSB = NULL;
    int * restrict HtS = NULL;
    int * restrict HtLB = NULL;
    int * restrict HtL = NULL;
    int * restrict Ex = NULL;
    int i = 0;
    int j = 0;
    int s1Len = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_NOVEC_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1 = parasail_memalign_int(16, s1Len);
    s2 = parasail_memalign_int(16, s2Len);
    HB = parasail_memalign_int(16, s1Len+1);
    H  = HB+1;
    HMB = parasail_memalign_int(16, s1Len+1);
    HM  = HMB+1;
    HSB = parasail_memalign_int(16, s1Len+1);
    HS  = HSB+1;
    HLB = parasail_memalign_int(16, s1Len+1);
    HL  = HLB+1;
    E  = parasail_memalign_int(16, s1Len);
    EM = parasail_memalign_int(16, s1Len);
    ES = parasail_memalign_int(16, s1Len);
    EL = parasail_memalign_int(16, s1Len);
    HtB= parasail_memalign_int(16, s1Len+1);
    Ht = HtB+1;
    HtMB= parasail_memalign_int(16, s1Len+1);
    HtM = HtMB+1;
    HtSB= parasail_memalign_int(16, s1Len+1);
    HtS = HtSB+1;
    HtLB= parasail_memalign_int(16, s1Len+1);
    HtL = HtLB+1;
    Ex = parasail_memalign_int(16, s1Len);

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2) return NULL;
    if (!HB) return NULL;
    if (!HMB) return NULL;
    if (!HSB) return NULL;
    if (!HLB) return NULL;
    if (!E) return NULL;
    if (!EM) return NULL;
    if (!ES) return NULL;
    if (!EL) return NULL;
    if (!HtB) return NULL;
    if (!HtMB) return NULL;
    if (!HtSB) return NULL;
    if (!HtLB) return NULL;
    if (!Ex) return NULL;

    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* initialize H,HM,HS,HL */
    H[-1] = 0;
    HM[-1] = 0;
    HS[-1] = 0;
    HL[-1] = 0;
    Ht[-1] = 0;
    for (i=0; i<s1Len; ++i) {
        H[i] = -open - i*gap;
        HM[i] = 0;
        HS[i] = 0;
        HL[i] = 0;
    }

    /* initialize E */
    for (i=0; i<s1Len; ++i) {
        E[i] = NEG_INF_32;
        EM[i] = 0;
        ES[i] = 0;
        EL[i] = 0;
    }

    /* iterate over database */
    for (j=0; j<s2Len; ++j) {
        int Ft = NEG_INF_32;
        int FtM = 0;
        int FtS = 0;
        int FtL = 0;
        /* calculate E */
        for (i=0; i<s1Len; ++i) {
            int E_opn = H[i]-open;
            int E_ext = E[i]-gap;
            if (E_opn > E_ext) {
                E[i] = E_opn;
                EM[i] = HM[i];
                ES[i] = HS[i];
                EL[i] = HL[i];
            }
            else {
                E[i] = E_ext;
            }
            EL[i] += 1;
        }
        /* calculate Ht */
        Ht[-1] = -open -j*gap;
        for (i=0; i<s1Len; ++i) {
            int matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                         matrix->matrix[matrix->size*s1[i]+s2[j]] :
                         matrix->matrix[matrix->size*i+s2[j]];
            int H_dag = H[i-1]+matval;
            Ex[i] = (E[i] > H_dag);
            if (H_dag >= E[i]) {
                Ht[i] = H_dag;
                HtM[i] = HM[i-1] + (s1[i]==s2[j]);
                HtS[i] = HS[i-1] + (matval > 0);
                HtL[i] = HL[i-1] + 1;
            }
            else {
                Ht[i] = E[i];
                HtM[i] = EM[i];
                HtS[i] = ES[i];
                HtL[i] = EL[i];
            }
        }
        /* calculate H,HM,HS,HL */
        for (i=0; i<s1Len; ++i) {
            int Ft_opn;
            int Ht_pre = Ht[i-1];
            int Ft_ext = Ft-gap;
            if (Ht_pre >= Ft_ext) {
                Ft = Ht_pre;
            }
            else {
                Ft = Ft_ext;
            }
            Ft_opn = Ft-open;
            if (H[i-1] > Ft_ext) {
                FtM = HM[i-1];
                FtS = HS[i-1];
                FtL = HL[i-1] + 1;
            }
            else {
                FtL = FtL + 1;
            }
            if (Ht[i] > Ft_opn) {
                H[i] = Ht[i];
                HM[i] = HtM[i];
                HS[i] = HtS[i];
                HL[i] = HtL[i];
            }
            else {
                H[i] = Ft_opn;
                if (Ht[i] == Ft_opn) {
                    if (Ex[i]) {
                        /* we favor F/up/del when F and E scores tie */
                        HM[i] = FtM;
                        HS[i] = FtS;
                        HL[i] = FtL;
                    }
                    else {
                        HM[i] = HtM[i];
                        HS[i] = HtS[i];
                        HL[i] = HtL[i];
                    }
                }
                else {
                    HM[i] = FtM;
                    HS[i] = FtS;
                    HL[i] = FtL;
                }
            }
#ifdef PARASAIL_TABLE
            result->stats->tables->score_table[1LL*i*s2Len + j] = H[i];
            result->stats->tables->matches_table[1LL*i*s2Len + j] = HM[i];
            result->stats->tables->similar_table[1LL*i*s2Len + j] = HS[i];
            result->stats->tables->length_table[1LL*i*s2Len + j] = HL[i];
#endif
        }
        H[-1] = -open - j*gap;
#ifdef PARASAIL_ROWCOL
        if (j == s2Len-1) {
            for (i=0; i<s1Len; ++i) {
                result->stats->rowcols->score_col[i] = H[i];
                result->stats->rowcols->matches_col[i] = HM[i];
                result->stats->rowcols->similar_col[i] = HS[i];
                result->stats->rowcols->length_col[i] = HL[i];
            }
        }
        result->stats->rowcols->score_row[j] = H[s1Len-1];
        result->stats->rowcols->matches_row[j] = HM[s1Len-1];
        result->stats->rowcols->similar_row[j] = HS[s1Len-1];
        result->stats->rowcols->length_row[j] = HL[s1Len-1];
#endif
    }

    result->score = H[s1Len-1];
    result->end_query = s1Len-1;
    result->end_ref = s2Len-1;
    result->stats->matches = HM[s1Len-1];
    result->stats->similar = HS[s1Len-1];
    result->stats->length = HL[s1Len-1];

    parasail_free(Ex);
    parasail_free(HtLB);
    parasail_free(HtSB);
    parasail_free(HtMB);
    parasail_free(HtB);
    parasail_free(EL);
    parasail_free(ES);
    parasail_free(EM);
    parasail_free(E);
    parasail_free(HLB);
    parasail_free(HSB);
    parasail_free(HMB);
    parasail_free(HB);
    parasail_free(s2);
    parasail_free(s1);

    return result;
}